

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deconvolutiondepthwise_x86.cpp
# Opt level: O0

int __thiscall
ncnn::DeconvolutionDepthWise_x86::create_pipeline(DeconvolutionDepthWise_x86 *this,Option *opt)

{
  int *piVar1;
  ulong uVar2;
  void **ppvVar3;
  undefined8 *puVar4;
  byte *in_RSI;
  long in_RDI;
  Mat weight_data_r2;
  int k;
  int i;
  float *p;
  float *pt;
  Mat weight_data_transposed;
  int elempack;
  int channels;
  int maxk;
  Option *in_stack_00000190;
  DeconvolutionDepthWise_x86 *in_stack_00000198;
  Allocator *in_stack_fffffffffffffda8;
  size_t in_stack_fffffffffffffdb0;
  undefined8 in_stack_fffffffffffffdb8;
  Mat *in_stack_fffffffffffffdc0;
  void **ppvVar5;
  Option *in_stack_fffffffffffffdc8;
  undefined8 in_stack_fffffffffffffdd0;
  int _elempack;
  undefined4 in_stack_fffffffffffffdd8;
  Mat *src;
  void *local_1f8;
  int *local_1f0;
  long *local_1d8;
  Allocator *in_stack_fffffffffffffe38;
  int in_stack_fffffffffffffe40;
  int in_stack_fffffffffffffe44;
  Mat *in_stack_fffffffffffffe48;
  int local_1b0;
  int local_1ac;
  Mat *local_1a8;
  void *local_190;
  void *local_188;
  int *local_180;
  undefined8 local_178;
  undefined4 local_170;
  long *local_168;
  undefined4 local_160;
  undefined4 local_15c;
  undefined4 local_158;
  undefined4 local_154;
  undefined4 local_150;
  undefined8 local_148;
  int local_13c;
  int local_138;
  int local_134;
  byte *local_130;
  int local_11c;
  undefined8 local_118;
  undefined8 local_110;
  undefined4 local_104;
  void **local_100;
  void **local_f8;
  undefined8 *local_f0;
  void **local_e8;
  void **local_d8;
  int local_c8;
  undefined4 local_c4;
  void **local_c0;
  void **local_b8;
  void **local_b0;
  int local_a8;
  undefined4 local_a4;
  void **local_a0;
  int local_88;
  undefined4 local_84;
  void **local_80;
  int local_68;
  undefined4 local_64;
  void **local_60;
  int local_58;
  undefined4 local_54;
  undefined8 *local_50;
  int local_48;
  undefined4 local_44;
  undefined8 *local_40;
  void *local_38;
  void *local_30;
  void *local_18;
  void *local_8;
  
  _elempack = (int)((ulong)in_stack_fffffffffffffdd0 >> 0x20);
  if (*(int *)(in_RDI + 0x168) == 0) {
    local_134 = *(int *)(in_RDI + 0xd4) * *(int *)(in_RDI + 0xd8);
    uVar2 = (long)*(int *)(in_RDI + 0x110) / (long)*(int *)(in_RDI + 0x114);
    local_138 = ((int)((long)((ulong)(uint)((int)uVar2 >> 0x1f) << 0x20 | uVar2 & 0xffffffff) /
                      (long)local_134) / (*(int *)(in_RDI + 0xd0) / *(int *)(in_RDI + 0x114))) *
                *(int *)(in_RDI + 0x114);
    local_130 = in_RSI;
    if ((local_138 == *(int *)(in_RDI + 0x114)) &&
       (*(int *)(in_RDI + 0x114) == *(int *)(in_RDI + 0xd0))) {
      local_13c = 1;
      if (((in_RSI[0x27] & 1) != 0) && (local_13c = 1, local_138 % 4 == 0)) {
        local_13c = 4;
      }
      local_104 = *(undefined4 *)(in_RDI + 0x19c);
      local_100 = &local_188;
      local_110 = 4;
      local_118 = 0;
      local_188 = (void *)0x0;
      local_180 = (int *)0x0;
      local_178 = 0;
      local_170 = 0;
      local_168 = (long *)0x0;
      local_160 = 0;
      local_15c = 0;
      local_158 = 0;
      local_154 = 0;
      local_150 = 0;
      local_148 = 0;
      Mat::create(in_stack_fffffffffffffdc0,(int)((ulong)in_stack_fffffffffffffdb8 >> 0x20),
                  in_stack_fffffffffffffdb0,in_stack_fffffffffffffda8);
      local_f8 = &local_188;
      local_190 = local_188;
      local_f0 = (undefined8 *)(in_RDI + 0x170);
      src = (Mat *)*local_f0;
      local_1a8 = src;
      for (local_1ac = 0;
          local_1ac <
          (local_138 / *(int *)(in_RDI + 0x114)) *
          (*(int *)(in_RDI + 0xd0) / *(int *)(in_RDI + 0x114)) * *(int *)(in_RDI + 0x114);
          local_1ac = local_1ac + 1) {
        for (local_1b0 = 0; local_1b0 < local_134; local_1b0 = local_1b0 + 1) {
          *(undefined4 *)((long)local_190 + (long)((local_134 + -1) - local_1b0) * 4) =
               *(undefined4 *)((long)&local_1a8->data + (long)local_1b0 * 4);
        }
        local_1a8 = (Mat *)((long)&local_1a8->data + (long)local_134 * 4);
        local_190 = (void *)((long)local_190 + (long)local_134 * 4);
      }
      if (local_13c == 4) {
        Mat::reshape(in_stack_fffffffffffffe48,in_stack_fffffffffffffe44,in_stack_fffffffffffffe40,
                     in_stack_fffffffffffffe38);
        convert_packing(src,(Mat *)CONCAT44(local_1ac,in_stack_fffffffffffffdd8),_elempack,
                        in_stack_fffffffffffffdc8);
        ppvVar3 = &local_1f8;
        local_e8 = ppvVar3;
        local_60 = ppvVar3;
        if (local_1f0 != (int *)0x0) {
          local_64 = 0xffffffff;
          LOCK();
          local_68 = *local_1f0;
          *local_1f0 = *local_1f0 + -1;
          UNLOCK();
          if (local_68 == 1) {
            if (local_1d8 == (long *)0x0) {
              if (local_1f8 != (void *)0x0) {
                free(local_1f8);
              }
            }
            else {
              (**(code **)(*local_1d8 + 0x18))(local_1d8,local_1f8);
            }
          }
        }
        *ppvVar3 = (void *)0x0;
        ppvVar3[2] = (void *)0x0;
        *(undefined4 *)(ppvVar3 + 3) = 0;
        *(undefined4 *)(ppvVar3 + 5) = 0;
        *(undefined4 *)((long)ppvVar3 + 0x2c) = 0;
        *(undefined4 *)(ppvVar3 + 6) = 0;
        *(undefined4 *)((long)ppvVar3 + 0x34) = 0;
        *(undefined4 *)(ppvVar3 + 7) = 0;
        ppvVar3[8] = (void *)0x0;
        ppvVar3[1] = (void *)0x0;
      }
      if (local_13c == 1) {
        ppvVar3 = (void **)(in_RDI + 0x218);
        local_c0 = &local_188;
        local_b8 = ppvVar3;
        local_b0 = ppvVar3;
        if (ppvVar3 != local_c0) {
          if (local_180 != (int *)0x0) {
            local_c4 = 1;
            LOCK();
            local_c8 = *local_180;
            *local_180 = *local_180 + 1;
            UNLOCK();
          }
          ppvVar5 = ppvVar3;
          local_a0 = ppvVar3;
          if (*(long *)(in_RDI + 0x220) != 0) {
            piVar1 = *(int **)(in_RDI + 0x220);
            local_a4 = 0xffffffff;
            LOCK();
            local_a8 = *piVar1;
            *piVar1 = *piVar1 + -1;
            UNLOCK();
            if (local_a8 == 1) {
              if (*(long *)(in_RDI + 0x238) == 0) {
                local_8 = *ppvVar3;
                if (local_8 != (void *)0x0) {
                  free(local_8);
                }
              }
              else {
                (**(code **)(**(long **)(in_RDI + 0x238) + 0x18))
                          (*(long **)(in_RDI + 0x238),*ppvVar3);
              }
            }
          }
          *ppvVar3 = (void *)0x0;
          ppvVar3[2] = (void *)0x0;
          *(undefined4 *)(ppvVar3 + 3) = 0;
          *(undefined4 *)(ppvVar3 + 5) = 0;
          *(undefined4 *)((long)ppvVar3 + 0x2c) = 0;
          *(undefined4 *)(ppvVar3 + 6) = 0;
          *(undefined4 *)((long)ppvVar3 + 0x34) = 0;
          *(undefined4 *)(ppvVar3 + 7) = 0;
          ppvVar3[8] = (void *)0x0;
          ppvVar3[1] = (void *)0x0;
          *ppvVar5 = *local_c0;
          ppvVar5[1] = local_c0[1];
          ppvVar5[2] = local_c0[2];
          *(undefined4 *)(ppvVar5 + 3) = *(undefined4 *)(local_c0 + 3);
          ppvVar5[4] = local_c0[4];
          *(undefined4 *)(ppvVar5 + 5) = *(undefined4 *)(local_c0 + 5);
          *(undefined4 *)((long)ppvVar5 + 0x2c) = *(undefined4 *)((long)local_c0 + 0x2c);
          *(undefined4 *)(ppvVar5 + 6) = *(undefined4 *)(local_c0 + 6);
          *(undefined4 *)((long)ppvVar5 + 0x34) = *(undefined4 *)((long)local_c0 + 0x34);
          *(undefined4 *)(ppvVar5 + 7) = *(undefined4 *)(local_c0 + 7);
          ppvVar5[8] = local_c0[8];
          local_b0 = ppvVar5;
        }
      }
      if ((*local_130 & 1) != 0) {
        puVar4 = (undefined8 *)(in_RDI + 0x170);
        local_40 = puVar4;
        if (*(long *)(in_RDI + 0x178) != 0) {
          piVar1 = *(int **)(in_RDI + 0x178);
          local_44 = 0xffffffff;
          LOCK();
          local_48 = *piVar1;
          *piVar1 = *piVar1 + -1;
          UNLOCK();
          if (local_48 == 1) {
            if (*(long *)(in_RDI + 400) == 0) {
              local_38 = (void *)*puVar4;
              if (local_38 != (void *)0x0) {
                free(local_38);
              }
            }
            else {
              (**(code **)(**(long **)(in_RDI + 400) + 0x18))(*(long **)(in_RDI + 400),*puVar4);
            }
          }
        }
        *puVar4 = 0;
        puVar4[2] = 0;
        *(undefined4 *)(puVar4 + 3) = 0;
        *(undefined4 *)(puVar4 + 5) = 0;
        *(undefined4 *)((long)puVar4 + 0x2c) = 0;
        *(undefined4 *)(puVar4 + 6) = 0;
        *(undefined4 *)((long)puVar4 + 0x34) = 0;
        *(undefined4 *)(puVar4 + 7) = 0;
        puVar4[8] = 0;
        puVar4[1] = 0;
      }
      local_11c = 0;
      ppvVar3 = &local_188;
      if (local_180 != (int *)0x0) {
        local_84 = 0xffffffff;
        LOCK();
        local_88 = *local_180;
        *local_180 = *local_180 + -1;
        UNLOCK();
        if (local_88 == 1) {
          local_d8 = ppvVar3;
          local_80 = ppvVar3;
          if (local_168 == (long *)0x0) {
            local_18 = local_188;
            if (local_188 != (void *)0x0) {
              free(local_188);
            }
          }
          else {
            (**(code **)(*local_168 + 0x18))(local_168,local_188);
          }
        }
      }
      *ppvVar3 = (void *)0x0;
      ppvVar3[2] = (void *)0x0;
      *(undefined4 *)(ppvVar3 + 3) = 0;
      *(undefined4 *)(ppvVar3 + 5) = 0;
      *(undefined4 *)((long)ppvVar3 + 0x2c) = 0;
      *(undefined4 *)(ppvVar3 + 6) = 0;
      *(undefined4 *)((long)ppvVar3 + 0x34) = 0;
      *(undefined4 *)(ppvVar3 + 7) = 0;
      ppvVar3[8] = (void *)0x0;
      ppvVar3[1] = (void *)0x0;
    }
    else {
      create_group_ops(in_stack_00000198,in_stack_00000190);
      if ((*local_130 & 1) != 0) {
        puVar4 = (undefined8 *)(in_RDI + 0x170);
        if (*(long *)(in_RDI + 0x178) != 0) {
          piVar1 = *(int **)(in_RDI + 0x178);
          local_54 = 0xffffffff;
          LOCK();
          local_58 = *piVar1;
          *piVar1 = *piVar1 + -1;
          UNLOCK();
          if (local_58 == 1) {
            local_50 = puVar4;
            if (*(long *)(in_RDI + 400) == 0) {
              local_30 = (void *)*puVar4;
              if (local_30 != (void *)0x0) {
                free(local_30);
              }
            }
            else {
              (**(code **)(**(long **)(in_RDI + 400) + 0x18))(*(long **)(in_RDI + 400),*puVar4);
            }
          }
        }
        *puVar4 = 0;
        *(undefined8 *)(in_RDI + 0x180) = 0;
        *(undefined4 *)(in_RDI + 0x188) = 0;
        *(undefined4 *)(in_RDI + 0x198) = 0;
        *(undefined4 *)(in_RDI + 0x19c) = 0;
        *(undefined4 *)(in_RDI + 0x1a0) = 0;
        *(undefined4 *)(in_RDI + 0x1a4) = 0;
        *(undefined4 *)(in_RDI + 0x1a8) = 0;
        *(undefined8 *)(in_RDI + 0x1b0) = 0;
        *(undefined8 *)(in_RDI + 0x178) = 0;
      }
      local_11c = 0;
    }
  }
  else {
    local_11c = 0;
  }
  return local_11c;
}

Assistant:

int DeconvolutionDepthWise_x86::create_pipeline(const Option& opt)
{
    if (dynamic_weight)
        return 0;

    const int maxk = kernel_w * kernel_h;
    int channels = (weight_data_size / group) / maxk / (num_output / group) * group;

    // depth-wise
    if (channels == group && group == num_output)
    {
        int elempack = 1;
#if __SSE2__
        if (opt.use_packing_layout)
        {
#if __AVX512F__
            elempack = channels % 16 == 0 ? 16 : channels % 8 == 0 ? 8 : channels % 4 == 0 ? 4 : 1;
#elif __AVX__
            elempack = channels % 8 == 0 ? 8 : channels % 4 == 0 ? 4 : 1;
#else
            elempack = channels % 4 == 0 ? 4 : 1;
#endif
        }
#endif // __SSE2__

        Mat weight_data_transposed(weight_data.w);
        {
            float* pt = weight_data_transposed;
            const float* p = weight_data;

            for (int i = 0; i < (channels / group) * (num_output / group) * group; i++)
            {
                for (int k = 0; k < maxk; k++)
                {
                    pt[maxk - 1 - k] = p[k];
                }

                p += maxk;
                pt += maxk;
            }
        }

#if __SSE2__
#if __AVX__
        // pack16
#if __AVX512F__
        if (elempack == 16)
        {
            Mat weight_data_r2 = weight_data_transposed.reshape(maxk, group);
            convert_packing(weight_data_r2, weight_data_tm, 16, opt);
        }
#endif // __AVX512F__

        // pack8
        if (elempack == 8)
        {
            Mat weight_data_r2 = weight_data_transposed.reshape(maxk, group);
            convert_packing(weight_data_r2, weight_data_tm, 8, opt);
        }
#endif // __AVX__

        // pack4
        if (elempack == 4)
        {
            Mat weight_data_r2 = weight_data_transposed.reshape(maxk, group);
            convert_packing(weight_data_r2, weight_data_tm, 4, opt);
        }
#endif // __SSE2__

        if (elempack == 1)
        {
            weight_data_tm = weight_data_transposed;
        }

        if (opt.lightmode)
            weight_data.release();

        return 0;
    }

    // group convolution
    create_group_ops(opt);

    if (opt.lightmode)
        weight_data.release();

    return 0;
}